

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O2

int __thiscall ncnn::Convolution::create_pipeline(Convolution *this,Option *opt)

{
  int *piVar1;
  Allocator *pAVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  Mat local_150;
  Mat local_108;
  Mat local_c0;
  Option opt_q;
  
  iVar5 = 0;
  iVar6 = 0;
  if ((((this->dynamic_weight == 0) && (opt->use_int8_inference == true)) &&
      (iVar6 = iVar5, (this->weight_data).elemsize == 4)) && (this->int8_scale_term != 0)) {
    iVar5 = this->kernel_h * this->kernel_w;
    uVar3 = (long)this->weight_data_size / (long)this->num_output;
    Mat::reshape(&local_c0,&this->weight_data,iVar5,
                 (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
                      (long)iVar5),this->num_output,(Allocator *)0x0);
    local_108.cstep = 0;
    local_108.data = (void *)0x0;
    local_108.refcount._0_4_ = 0;
    local_108.refcount._4_4_ = 0;
    local_108.elemsize._0_4_ = 0;
    local_108._20_8_ = 0;
    local_108.allocator = (Allocator *)0x0;
    local_108.dims = 0;
    local_108.w = 0;
    local_108.h = 0;
    local_108.d = 0;
    local_108.c = 0;
    opt_q.lightmode = opt->lightmode;
    opt_q._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_q.num_threads = opt->num_threads;
    opt_q.workspace_allocator = opt->workspace_allocator;
    opt_q.openmp_blocktime = opt->openmp_blocktime;
    opt_q.use_winograd_convolution = opt->use_winograd_convolution;
    opt_q.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_q.use_int8_inference = opt->use_int8_inference;
    opt_q.use_vulkan_compute = opt->use_vulkan_compute;
    uVar3._0_1_ = opt->use_bf16_storage;
    uVar3._1_1_ = opt->use_fp16_packed;
    uVar3._2_1_ = opt->use_fp16_storage;
    uVar3._3_1_ = opt->use_fp16_arithmetic;
    uVar3._4_1_ = opt->use_int8_packed;
    uVar3._5_1_ = opt->use_int8_storage;
    uVar3._6_1_ = opt->use_int8_arithmetic;
    uVar3._7_1_ = opt->use_packing_layout;
    opt_q.use_shader_pack8 = opt->use_shader_pack8;
    opt_q.use_subgroup_basic = opt->use_subgroup_basic;
    opt_q.use_subgroup_vote = opt->use_subgroup_vote;
    opt_q.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_q.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_q.use_image_storage = opt->use_image_storage;
    opt_q.use_tensor_storage = opt->use_tensor_storage;
    opt_q.use_reserved_0 = opt->use_reserved_0;
    opt_q.flush_denormals = opt->flush_denormals;
    opt_q.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_q.use_shader_local_memory = opt->use_shader_local_memory;
    opt_q.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_q.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_q.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_q.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_q.use_reserved_6 = opt->use_reserved_6;
    opt_q.use_reserved_7 = opt->use_reserved_7;
    opt_q.use_reserved_8 = opt->use_reserved_8;
    opt_q.use_reserved_9 = opt->use_reserved_9;
    opt_q.use_reserved_10 = opt->use_reserved_10;
    opt_q.use_reserved_11 = opt->use_reserved_11;
    opt_q.blob_allocator = (this->weight_data).allocator;
    opt_q._32_8_ = uVar3 & 0xffffffffffffff;
    quantize_to_int8(&local_c0,&local_108,&this->weight_data_int8_scales,&opt_q);
    if ((local_108.data == (void *)0x0) || ((long)local_108.c * local_108.cstep == 0)) {
      bVar4 = false;
    }
    else {
      Mat::reshape(&local_150,&local_108,this->weight_data_size,(Allocator *)0x0);
      if (&this->weight_data != &local_150) {
        if (local_150.refcount != (int *)0x0) {
          LOCK();
          *local_150.refcount = *local_150.refcount + 1;
          UNLOCK();
        }
        piVar1 = (this->weight_data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pAVar2 = (this->weight_data).allocator;
            if (pAVar2 == (Allocator *)0x0) {
              free((this->weight_data).data);
            }
            else {
              (*pAVar2->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data).data = local_150.data;
        (this->weight_data).refcount = local_150.refcount;
        (this->weight_data).elemsize = local_150.elemsize;
        (this->weight_data).elempack = local_150.elempack;
        (this->weight_data).allocator = local_150.allocator;
        (this->weight_data).dims = local_150.dims;
        (this->weight_data).w = local_150.w;
        (this->weight_data).h = local_150.h;
        (this->weight_data).d = local_150.d;
        (this->weight_data).c = local_150.c;
        (this->weight_data).cstep = local_150.cstep;
      }
      if (local_150.refcount != (int *)0x0) {
        LOCK();
        *local_150.refcount = *local_150.refcount + -1;
        UNLOCK();
        if (*local_150.refcount == 0) {
          if (local_150.allocator == (Allocator *)0x0) {
            free(local_150.data);
          }
          else {
            (*(local_150.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      bVar4 = true;
    }
    piVar1 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_108.allocator == (Allocator *)0x0) {
          free(local_108.data);
        }
        else {
          (*(local_108.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (local_c0.refcount != (int *)0x0) {
      LOCK();
      *local_c0.refcount = *local_c0.refcount + -1;
      UNLOCK();
      if (*local_c0.refcount == 0) {
        if (local_c0.allocator == (Allocator *)0x0) {
          free(local_c0.data);
        }
        else {
          (*(local_c0.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (!bVar4) {
      iVar6 = -100;
    }
  }
  return iVar6;
}

Assistant:

int Convolution::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

#if NCNN_INT8
    // runtime quantize the weight data
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)4u && int8_scale_term)
    {
        const int maxk = kernel_w * kernel_h;
        const int num_input = weight_data_size / num_output / maxk;

        Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

        Mat weight_data_int8;

        Option opt_q = opt;
        opt_q.blob_allocator = weight_data.allocator;
        opt_q.use_packing_layout = false;
        quantize_to_int8(weight_data_r2, weight_data_int8, weight_data_int8_scales, opt_q);
        if (weight_data_int8.empty())
            return -100;

        weight_data = weight_data_int8.reshape(weight_data_size);
    }
#else
    (void)(opt);
#endif // NCNN_INT8

    return 0;
}